

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O3

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  real_t *prVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  pointer pNVar12;
  pointer pNVar13;
  int iVar14;
  long lVar15;
  pointer pfVar16;
  int iVar17;
  ulong __n;
  real_t *prVar18;
  Model *pMVar19;
  float fVar20;
  float fVar21;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar22;
  undefined1 auVar26 [16];
  float fVar23;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  real_t rVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM6 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_109;
  SparseRow *local_108;
  real_t local_fc;
  undefined1 local_f8 [16];
  Model *local_e0;
  real_t *local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  pointer local_b8;
  pointer local_b0;
  real_t *local_a8;
  real_t *local_a0;
  real_t *local_98;
  value_type_conflict1 local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  real_t local_78;
  real_t rStack_74;
  real_t rStack_70;
  real_t rStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  auVar34._4_60_ = in_register_00001244;
  auVar34._0_4_ = norm;
  local_108 = row;
  local_fc = norm;
  if (norm < 0.0) {
    fVar23 = sqrtf(norm);
  }
  else {
    auVar25 = vsqrtss_avx(auVar34._0_16_,auVar34._0_16_);
    fVar23 = auVar25._0_4_;
  }
  auVar25 = in_ZMM6._0_16_;
  uVar4 = model->num_feat_;
  pNVar13 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_e0 = model;
  if (pNVar13 != pNVar12) {
    prVar18 = model->param_w_;
    do {
      uVar5 = pNVar13->feat_id;
      if (uVar5 < uVar4) {
        uVar9 = uVar5 * 3;
        uVar6 = uVar5 * 3 + 1;
        fVar22 = prVar18[uVar6];
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)(pg * pNVar13->feat_val * fVar23)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416((uint)prVar18[uVar9]));
        auVar25 = vfmadd213ss_fma(auVar27,auVar27,ZEXT416((uint)fVar22));
        fVar20 = auVar25._0_4_;
        prVar18[uVar6] = fVar20;
        if (fVar20 < 0.0) {
          local_f8._0_4_ = fVar22;
          fVar20 = sqrtf(fVar20);
          fVar22 = (float)local_f8._0_4_;
        }
        else {
          auVar25 = vsqrtss_avx(auVar25,auVar25);
          fVar20 = auVar25._0_4_;
        }
        if (fVar22 < 0.0) {
          local_f8._0_4_ = fVar20;
          fVar22 = sqrtf(fVar22);
          fVar20 = (float)local_f8._0_4_;
        }
        else {
          auVar25 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
          fVar22 = auVar25._0_4_;
        }
        auVar25._0_4_ = (fVar20 - fVar22) / (this->super_Score).alpha_;
        auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
        uVar5 = uVar5 * 3 + 2;
        auVar25 = vfnmadd231ss_fma(ZEXT416(auVar27._0_4_),auVar25,ZEXT416((uint)prVar18[uVar9]));
        fVar20 = auVar25._0_4_ + prVar18[uVar5];
        auVar27 = ZEXT816(0);
        uVar7 = vcmpss_avx512f(auVar27,ZEXT416((uint)fVar20),1);
        bVar8 = (bool)((byte)uVar7 & 1);
        prVar18[uVar5] = fVar20;
        fVar22 = (this->super_Score).lambda_1_;
        fVar24 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
        if (fVar22 < fVar20 * fVar24) {
          fVar21 = prVar18[uVar6];
          rVar30 = (this->super_Score).beta_;
          if (fVar21 < 0.0) {
            local_f8._0_4_ = fVar22;
            local_c8 = ZEXT416((uint)fVar24);
            local_d8 = (real_t *)CONCAT44(local_d8._4_4_,rVar30);
            fVar21 = sqrtf(fVar21);
            rVar30 = local_d8._0_4_;
            fVar22 = (float)local_f8._0_4_;
            auVar25 = local_c8;
          }
          else {
            auVar25 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
            fVar21 = auVar25._0_4_;
            auVar25 = ZEXT416((uint)fVar24);
          }
          auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar22),auVar25,ZEXT416((uint)fVar20));
          auVar27._0_4_ =
               auVar25._0_4_ /
               ((rVar30 + fVar21) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar27._4_12_ = auVar25._4_12_;
        }
        prVar18[uVar9] = auVar27._0_4_;
        pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      auVar25 = in_ZMM6._0_16_;
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 != pNVar12);
  }
  pMVar19 = local_e0;
  prVar18 = local_e0->param_b_;
  fVar23 = prVar18[1];
  auVar27 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar23));
  fVar22 = auVar27._0_4_;
  prVar18[1] = fVar22;
  if (fVar22 < 0.0) {
    fVar22 = sqrtf(fVar22);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    fVar22 = auVar27._0_4_;
  }
  if (fVar23 < 0.0) {
    fVar23 = sqrtf(fVar23);
  }
  else {
    auVar27 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
    fVar23 = auVar27._0_4_;
  }
  auVar26._0_4_ = (fVar22 - fVar23) / (this->super_Score).alpha_;
  auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar27 = vfnmadd132ss_fma(auVar26,ZEXT416((uint)pg),ZEXT416((uint)*prVar18));
  auVar31._0_12_ = ZEXT812(0);
  auVar31._12_4_ = 0;
  fVar22 = auVar27._0_4_ + prVar18[2];
  uVar7 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar22),1);
  bVar8 = (bool)((byte)uVar7 & 1);
  prVar18[2] = fVar22;
  fVar23 = (this->super_Score).lambda_1_;
  fVar20 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
  if (fVar23 < fVar22 * fVar20) {
    auVar27 = vfmsub213ss_fma(ZEXT416((uint)fVar23),ZEXT416((uint)fVar20),ZEXT416((uint)fVar22));
    fVar23 = prVar18[1];
    fVar22 = (this->super_Score).beta_;
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
      auVar27 = ZEXT416(auVar27._0_4_);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar23 = auVar26._0_4_;
    }
    auVar31._0_4_ =
         auVar27._0_4_ /
         ((fVar22 + fVar23) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar31._4_12_ = auVar27._4_12_;
  }
  *prVar18 = auVar31._0_4_;
  auVar27 = vcvtusi2ss_avx512f(auVar25,pMVar19->num_K_);
  rVar30 = (this->super_Score).lambda_2_;
  local_88._4_4_ = rVar30;
  local_88._0_4_ = rVar30;
  fStack_80 = rVar30;
  fStack_7c = rVar30;
  auVar27 = ZEXT416((uint)(auVar27._0_4_ * 0.25));
  auVar27 = vroundss_avx(auVar27,auVar27,10);
  iVar14 = vcvttss2usi_avx512f(auVar27);
  local_78 = (this->super_Score).alpha_;
  uVar5 = iVar14 * 4;
  __n = (ulong)uVar5;
  auVar27 = vcvtusi2ss_avx512f(auVar25,pMVar19->aux_size_);
  local_8c = 0.0;
  rStack_74 = local_78;
  rStack_70 = local_78;
  rStack_6c = local_78;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,__n,&local_8c,&local_109);
  pNVar13 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar13 != pNVar12) {
    auVar25 = vcvtusi2ss_avx512f(auVar25,uVar5);
    iVar17 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar25._0_4_ * auVar27._0_4_)));
    do {
      uVar6 = pNVar13->feat_id;
      if ((uVar6 < uVar4) && (__n != 0)) {
        fVar23 = local_fc * pNVar13->feat_val;
        uVar11 = 0;
        prVar18 = pMVar19->param_v_;
        do {
          pfVar1 = prVar18 + uVar6 * iVar17 + uVar11;
          pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11;
          auVar32._0_4_ = fVar23 * *pfVar1 + *pfVar2;
          auVar32._4_4_ = fVar23 * pfVar1[1] + pfVar2[1];
          auVar32._8_4_ = fVar23 * pfVar1[2] + pfVar2[2];
          auVar32._12_4_ = fVar23 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar11) = auVar32;
          uVar11 = uVar11 + 4;
        } while (uVar11 < __n);
        pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 != pNVar12);
    pNVar13 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pNVar13 != pNVar12) {
      local_b0 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar16 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      rVar30 = local_fc;
      local_cc = iVar17;
      do {
        if ((pNVar13->feat_id < uVar4) && (uVar5 != 0)) {
          local_58 = rVar30 * pNVar13->feat_val;
          uVar11 = 0;
          prVar18 = pMVar19->param_v_ + pNVar13->feat_id * iVar17;
          local_a0 = prVar18 + __n;
          local_68 = local_58 * pg;
          local_a8 = prVar18 + (uint)(iVar14 << 3);
          local_b8 = pNVar13;
          local_98 = prVar18;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          do {
            lVar15 = 4;
            pfVar1 = local_98 + uVar11;
            fVar23 = *pfVar1;
            fVar22 = pfVar1[1];
            fVar20 = pfVar1[2];
            fVar24 = pfVar1[3];
            auVar36._0_4_ = fVar23 * local_58;
            auVar36._4_4_ = fVar22 * fStack_54;
            auVar36._8_4_ = fVar20 * fStack_50;
            auVar36._12_4_ = fVar24 * fStack_4c;
            auVar25 = *(undefined1 (*) [16])(local_a0 + uVar11);
            auVar27 = vsubps_avx(*(undefined1 (*) [16])(pfVar16 + uVar11),auVar36);
            auVar28._0_4_ = fVar23 * (float)local_88._0_4_ + auVar27._0_4_ * local_68;
            auVar28._4_4_ = fVar22 * (float)local_88._4_4_ + auVar27._4_4_ * fStack_64;
            auVar28._8_4_ = fVar20 * fStack_80 + auVar27._8_4_ * fStack_60;
            auVar28._12_4_ = fVar24 * fStack_7c + auVar27._12_4_ * fStack_5c;
            auVar35._0_4_ = auVar25._0_4_ + auVar28._0_4_ * auVar28._0_4_;
            auVar35._4_4_ = auVar25._4_4_ + auVar28._4_4_ * auVar28._4_4_;
            auVar35._8_4_ = auVar25._8_4_ + auVar28._8_4_ * auVar28._8_4_;
            auVar35._12_4_ = auVar25._12_4_ + auVar28._12_4_ * auVar28._12_4_;
            auVar25 = vsqrtps_avx(auVar25);
            auVar27 = vsqrtps_avx(auVar35);
            auVar25 = vsubps_avx(auVar27,auVar25);
            auVar10._4_4_ = rStack_74;
            auVar10._0_4_ = local_78;
            auVar10._8_4_ = rStack_70;
            auVar10._12_4_ = rStack_6c;
            auVar25 = vdivps_avx(auVar25,auVar10);
            auVar33._0_4_ = fVar23 * auVar25._0_4_;
            auVar33._4_4_ = fVar22 * auVar25._4_4_;
            auVar33._8_4_ = fVar20 * auVar25._8_4_;
            auVar33._12_4_ = fVar24 * auVar25._12_4_;
            auVar25 = vsubps_avx(auVar28,auVar33);
            pfVar1 = local_a8 + uVar11;
            fVar23 = pfVar1[1];
            fVar22 = pfVar1[2];
            fVar20 = pfVar1[3];
            prVar3 = local_a8 + uVar11;
            *prVar3 = auVar25._0_4_ + *pfVar1;
            prVar3[1] = auVar25._4_4_ + fVar23;
            prVar3[2] = auVar25._8_4_ + fVar22;
            prVar3[3] = auVar25._12_4_ + fVar20;
            *(undefined1 (*) [16])(local_a0 + uVar11) = auVar35;
            local_d8 = prVar18;
            do {
              fVar23 = prVar18[(uint)(iVar14 << 3)];
              auVar29 = ZEXT816(0) << 0x40;
              fVar22 = (this->super_Score).lambda_1_;
              uVar7 = vcmpss_avx512f(auVar29,ZEXT416((uint)fVar23),1);
              bVar8 = (bool)((byte)uVar7 & 1);
              fVar20 = (float)((uint)bVar8 * 0x3f800000 + (uint)!bVar8 * -0x40800000);
              if (fVar22 < fVar23 * fVar20) {
                fVar24 = prVar18[__n];
                fVar21 = (this->super_Score).beta_;
                if (fVar24 < 0.0) {
                  local_f8 = ZEXT416((uint)fVar20);
                  local_c8._0_4_ = fVar21;
                  fVar24 = sqrtf(fVar24);
                  fVar21 = (float)local_c8._0_4_;
                  auVar25 = local_f8;
                }
                else {
                  auVar25 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
                  fVar24 = auVar25._0_4_;
                  auVar25 = ZEXT416((uint)fVar20);
                }
                auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar22),auVar25,ZEXT416((uint)fVar23));
                auVar29._0_4_ =
                     auVar25._0_4_ /
                     ((fVar21 + fVar24) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_
                     );
                auVar29._4_12_ = auVar25._4_12_;
              }
              *prVar18 = auVar29._0_4_;
              prVar18 = prVar18 + 1;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar11 = uVar11 + 4;
            prVar18 = local_d8 + 4;
            pfVar16 = local_b0;
          } while (uVar11 < __n);
          pNVar12 = (local_108->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          pNVar13 = local_b8;
          pMVar19 = local_e0;
          iVar17 = local_cc;
          rVar30 = local_fc;
        }
        pNVar13 = pNVar13 + 1;
      } while (pNVar13 != pNVar12);
    }
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}